

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void idwpt_per(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  wave_object pwVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  long local_38;
  
  pwVar1 = wt->wave;
  iVar8 = pwVar1->hpr_len + pwVar1->lpr_len;
  uVar4 = (long)iVar8 / 4;
  iVar3 = (int)uVar4;
  uVar6 = (len_cA + iVar3) - 1;
  lVar9 = (long)len_cA;
  uVar12 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    uVar4 = uVar12;
  }
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  local_38 = -2;
  lVar13 = -1;
  do {
    if (uVar12 == uVar6) {
      return;
    }
    X[local_38 + 2] = 0.0;
    X[lVar13 + 2] = 0.0;
    local_38 = local_38 + 2;
    lVar13 = lVar13 + 2;
    dVar16 = 0.0;
    dVar17 = 0.0;
    lVar15 = 0;
    uVar11 = uVar12;
    for (lVar5 = 0; uVar4 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      if ((long)uVar11 < lVar9 && -1 < (long)uVar11) {
        pdVar10 = pwVar1->lpr;
        pdVar7 = (double *)((long)pdVar10 + lVar5);
        uVar14 = uVar11;
LAB_00106572:
        pdVar2 = pwVar1->hpr;
        dVar17 = dVar17 + *pdVar7 * cA[uVar14] + *(double *)((long)pdVar2 + lVar5) * cD[uVar14];
        X[local_38] = dVar17;
        dVar16 = dVar16 + *(double *)((long)pdVar10 + lVar5 + 8) * cA[uVar14] +
                          *(double *)((long)pdVar2 + lVar5 + 8) * cD[uVar14];
        X[lVar13] = dVar16;
      }
      else {
        if ((long)uVar11 < (long)(len_cA + iVar8 / 2 + -1) && lVar9 <= (long)uVar11) {
          pdVar10 = pwVar1->lpr;
          pdVar7 = pdVar10 + lVar15 * 2;
          uVar14 = (uVar12 - lVar15) - lVar9;
          goto LAB_00106572;
        }
        if (((long)uVar11 < 0) && ((long)-iVar3 < (long)uVar11)) {
          pdVar10 = pwVar1->lpr;
          pdVar7 = pdVar10 + lVar15 * 2;
          uVar14 = (ulong)(len_cA + (int)uVar11);
          goto LAB_00106572;
        }
      }
      lVar15 = lVar15 + 1;
      uVar11 = uVar11 - 1;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void idwpt_per(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, l2;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				X[m] += wt->wave->lpr[t] * cA[i - l - len_cA] + wt->wave->hpr[t] * cD[i - l - len_cA];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l - len_cA] + wt->wave->hpr[t + 1] * cD[i - l - len_cA];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				X[m] += wt->wave->lpr[t] * cA[len_cA + i - l] + wt->wave->hpr[t] * cD[len_cA + i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[len_cA + i - l] + wt->wave->hpr[t + 1] * cD[len_cA + i - l];
			}
		}
	}
}